

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Otter.cpp
# Opt level: O2

void __thiscall Saturation::Otter::onPassiveAdded(Otter *this,Clause *cl)

{
  SaturationAlgorithm::onPassiveAdded(&this->super_SaturationAlgorithm,cl);
  if ((cl->field_0x3b & 0xe) != 0) {
    return;
  }
  Lib::SingleParamEvent<Kernel::Clause_*>::fire
            (&(this->_simplCont).super_ClauseContainer.addedEvent,cl);
  return;
}

Assistant:

void Otter::onPassiveAdded(Clause* cl)
{
  SaturationAlgorithm::onPassiveAdded(cl);

  if(cl->store()==Clause::PASSIVE) {
    _simplCont.add(cl);
  }
}